

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_c_Test::TestBody(PhPacker_Arg_c_Test *this)

{
  char cVar1;
  char *pcVar2;
  char result;
  char expected;
  AssertionResult gtest_ar;
  string str;
  char local_5a [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined1 local_50 [8];
  _Storage local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  AssertHelper local_30;
  string local_28;
  
  PhPacker::pack<signed_char,_0>(&local_28,'c','\f');
  PhPacker::unpack((PhPacker *)local_50,'c',&local_28);
  pcVar2 = (char *)std::__any_caster<signed_char>((any *)local_50);
  if (pcVar2 == (char *)0x0) {
    std::__throw_bad_any_cast();
  }
  cVar1 = *pcVar2;
  if (local_50 != (undefined1  [8])0x0) {
    (*(code *)local_50)(3,local_50,0);
    local_50 = (undefined1  [8])0x0;
  }
  local_5a[1] = 0xc;
  local_5a[0] = cVar1;
  testing::internal::CmpHelperEQ<signed_char,signed_char>
            ((internal *)local_50,"result","expected",local_5a,local_5a + 1);
  if (local_50[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_48._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_50 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._M_ptr);
    }
    PhPacker::pack<signed_char,_0>((string *)local_50,'c',-0x4d);
    std::__cxx11::string::operator=((string *)&local_28,(string *)local_50);
    if (local_50 != (undefined1  [8])(local_50 + 0x10)) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_50,'c',&local_28);
    pcVar2 = (char *)std::__any_caster<signed_char>((any *)local_50);
    if (pcVar2 == (char *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_5a[0] = *pcVar2;
    if (local_50 != (undefined1  [8])0x0) {
      (*(code *)local_50)(3,local_50,0);
      local_50 = (undefined1  [8])0x0;
    }
    local_5a[1] = 0xb3;
    testing::internal::CmpHelperEQ<signed_char,signed_char>
              ((internal *)local_50,"result","expected",local_5a,local_5a + 1);
    if (local_50[0] != (PhPacker)0x0) goto LAB_00111df6;
    testing::Message::Message((Message *)&local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_48._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x19c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_00111df6:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_c)
{
   std::string str = PhPacker::pack<signed char>('c', 12);
   signed char result = std::any_cast<signed char>(PhPacker::unpack('c', str));
   signed char expected = 12;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<signed char>('c', -77);
   result = std::any_cast<signed char>(PhPacker::unpack('c', str));
   expected = -77;
   GTEST_ASSERT_EQ(result, expected);
}